

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O3

C_matrix<double> * __thiscall
C_matrix<double>::operator*
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,double *x)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  uint uVar6;
  unsigned_short l;
  unsigned_short c;
  uint uVar7;
  
  C_matrix(__return_storage_ptr__,this->m_L,this->m_C);
  iVar5 = this->m_L;
  if (0 < iVar5) {
    iVar3 = this->m_C;
    uVar7 = 0;
    l = 0;
    do {
      if (0 < iVar3) {
        uVar6 = 0;
        c = 0;
        do {
          dVar1 = this->m_A[(int)(iVar3 * uVar7 + uVar6)];
          dVar2 = *x;
          pdVar4 = operator()(__return_storage_ptr__,l,c);
          *pdVar4 = dVar1 * dVar2;
          c = c + 1;
          uVar6 = (uint)c;
          iVar3 = this->m_C;
        } while ((int)uVar6 < iVar3);
        iVar5 = this->m_L;
      }
      l = l + 1;
      uVar7 = (uint)l;
    } while ((int)uVar7 < iVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator* (const dataType& x)
{
    C_matrix B(m_L,m_C);
    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            B(i,j) = m_A[getIndex(i,j)]*x;
        }
    }
    return B;
}